

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1objs.c
# Opt level: O3

void T1_Size_Done(FT_Size t1size)

{
  undefined8 *puVar1;
  code *pcVar2;
  FT_Module pFVar3;
  long lVar4;
  T1_Size size;
  PSHinter_Service pshinter;
  
  if (t1size->internal->module_data != (void *)0x0) {
    puVar1 = *(undefined8 **)&t1size->face[3].units_per_EM;
    pFVar3 = FT_Get_Module((t1size->face->driver->root).library,"pshinter");
    if ((puVar1 != (undefined8 *)0x0 && pFVar3 != (FT_Module)0x0) &&
       (pcVar2 = (code *)*puVar1, pcVar2 != (code *)0x0)) {
      lVar4 = (*pcVar2)(pFVar3);
      if (lVar4 != 0) {
        (**(code **)(lVar4 + 0x10))(t1size->internal->module_data);
      }
    }
    t1size->internal->module_data = (void *)0x0;
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  T1_Size_Done( FT_Size  t1size )          /* T1_Size */
  {
    T1_Size  size = (T1_Size)t1size;


    if ( t1size->internal->module_data )
    {
      PSH_Globals_Funcs  funcs;


      funcs = T1_Size_Get_Globals_Funcs( size );
      if ( funcs )
        funcs->destroy( (PSH_Globals)t1size->internal->module_data );

      t1size->internal->module_data = NULL;
    }
  }